

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::UniformLocMixWithImplicit3::Run(UniformLocMixWithImplicit3 *this)

{
  long lVar1;
  DefOccurence local_fe0;
  DefOccurence local_fdc;
  LayoutSpecifierBase local_fd8;
  LayoutSpecifierBase local_fc8;
  UniformType local_fb8;
  Uniform local_f28;
  LayoutSpecifierBase local_d50;
  DefOccurence local_d40;
  DefOccurence local_d3c;
  LayoutSpecifierBase local_d38;
  LayoutSpecifierBase local_d28;
  UniformType local_d18;
  Uniform local_c88;
  LayoutSpecifierBase local_ab0;
  DefOccurence local_aa0;
  DefOccurence local_a9c;
  LayoutSpecifierBase local_a98;
  LayoutSpecifierBase local_a88;
  UniformType local_a78;
  Uniform local_9e8;
  LayoutSpecifierBase local_810;
  DefOccurence local_800;
  DefOccurence local_7fc;
  LayoutSpecifierBase local_7f8;
  LayoutSpecifierBase local_7e8;
  UniformType local_7d8;
  Uniform local_748;
  LayoutSpecifierBase local_570;
  DefOccurence local_560;
  DefOccurence local_55c;
  LayoutSpecifierBase local_558;
  LayoutSpecifierBase local_548;
  UniformType local_538;
  Uniform local_4a8;
  LayoutSpecifierBase local_2d0;
  DefOccurence local_2c0;
  DefOccurence local_2bc;
  LayoutSpecifierBase local_2b8;
  LayoutSpecifierBase local_2a8;
  UniformType local_290;
  Uniform local_200;
  undefined1 local_28 [8];
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  uniforms;
  UniformLocMixWithImplicit3 *this_local;
  
  uniforms.
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::vector((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
            *)local_28);
  UniformType::UniformType(&local_290,0x1406,0);
  local_2b8 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::C(0,Dec);
  local_2a8 = local_2b8;
  DefOccurence::DefOccurence(&local_2bc,ALL_SH);
  DefOccurence::DefOccurence(&local_2c0,NONE_SH);
  local_2d0 = local_2a8;
  anon_unknown_0::Uniform::Uniform
            (&local_200,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             &local_290,(Loc)local_2a8,local_2bc,local_2c0);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
               *)local_28,&local_200);
  anon_unknown_0::Uniform::~Uniform(&local_200);
  UniformType::~UniformType(&local_290);
  UniformType::UniformType(&local_538,0x8b51,0);
  local_558 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::C(2,Dec);
  local_548 = local_558;
  DefOccurence::DefOccurence(&local_55c,ALL_SH);
  DefOccurence::DefOccurence(&local_560,NONE_SH);
  local_570 = local_548;
  anon_unknown_0::Uniform::Uniform
            (&local_4a8,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             &local_538,(Loc)local_548,local_55c,local_560);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
               *)local_28,&local_4a8);
  anon_unknown_0::Uniform::~Uniform(&local_4a8);
  UniformType::~UniformType(&local_538);
  UniformType::UniformType(&local_7d8,0x1404,0);
  local_7f8 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::C(3,Dec);
  local_7e8 = local_7f8;
  DefOccurence::DefOccurence(&local_7fc,ALL_SH);
  DefOccurence::DefOccurence(&local_800,NONE_SH);
  local_810 = local_7e8;
  anon_unknown_0::Uniform::Uniform
            (&local_748,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             &local_7d8,(Loc)local_7e8,local_7fc,local_800);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
               *)local_28,&local_748);
  anon_unknown_0::Uniform::~Uniform(&local_748);
  UniformType::~UniformType(&local_7d8);
  UniformType::UniformType(&local_a78,0x1406,0);
  local_a98 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::Implicit();
  local_a88 = local_a98;
  DefOccurence::DefOccurence(&local_a9c,ALL_SH);
  DefOccurence::DefOccurence(&local_aa0,ALL_SH);
  local_ab0 = local_a88;
  anon_unknown_0::Uniform::Uniform
            (&local_9e8,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             &local_a78,(Loc)local_a88,local_a9c,local_aa0);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
               *)local_28,&local_9e8);
  anon_unknown_0::Uniform::~Uniform(&local_9e8);
  UniformType::~UniformType(&local_a78);
  UniformType::UniformType(&local_d18,0x8b51,0);
  local_d38 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::Implicit();
  local_d28 = local_d38;
  DefOccurence::DefOccurence(&local_d3c,ALL_SH);
  DefOccurence::DefOccurence(&local_d40,ALL_SH);
  local_d50 = local_d28;
  anon_unknown_0::Uniform::Uniform
            (&local_c88,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             &local_d18,(Loc)local_d28,local_d3c,local_d40);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
               *)local_28,&local_c88);
  anon_unknown_0::Uniform::~Uniform(&local_c88);
  UniformType::~UniformType(&local_d18);
  UniformType::UniformType(&local_fb8,0x1404,0);
  local_fd8 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::Implicit();
  local_fc8 = local_fd8;
  DefOccurence::DefOccurence(&local_fdc,ALL_SH);
  DefOccurence::DefOccurence(&local_fe0,ALL_SH);
  anon_unknown_0::Uniform::Uniform
            (&local_f28,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             &local_fb8,(Loc)local_fc8,local_fdc,local_fe0);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
               *)local_28,&local_f28);
  anon_unknown_0::Uniform::~Uniform(&local_f28);
  UniformType::~UniformType(&local_fb8);
  lVar1 = ExplicitUniformLocationCaseBase::doRun
                    (&this->super_ExplicitUniformLocationCaseBase,
                     (vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                      *)local_28);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::~vector((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
             *)local_28);
  return lVar1;
}

Assistant:

virtual long Run()
	{
		//layout (location = 0) uniform float     u0; //unused
		//layout (location = 2) uniform vec3      u1; //unused
		//layout (location = 3) uniform int       u2; //unused

		//uniform float     u3;
		//uniform vec3      u4;
		//uniform int       u5;
		std::vector<Uniform> uniforms;
		uniforms.push_back(
			Uniform(uniformValueGenerator, GL_FLOAT, Loc::C(0), DefOccurence::ALL_SH, DefOccurence::NONE_SH));
		uniforms.push_back(
			Uniform(uniformValueGenerator, GL_FLOAT_VEC3, Loc::C(2), DefOccurence::ALL_SH, DefOccurence::NONE_SH));
		uniforms.push_back(
			Uniform(uniformValueGenerator, GL_INT, Loc::C(3), DefOccurence::ALL_SH, DefOccurence::NONE_SH));
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT, Loc::Implicit()));
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT_VEC3, Loc::Implicit()));
		uniforms.push_back(Uniform(uniformValueGenerator, GL_INT, Loc::Implicit()));
		return doRun(uniforms);
	}